

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_vector.hpp
# Opt level: O2

void __thiscall
poplar::compact_vector::compact_vector
          (compact_vector *this,uint64_t size,uint32_t width,uint64_t init)

{
  uint64_t i;
  uint64_t i_00;
  
  compact_vector(this,size,width);
  for (i_00 = 0; size != i_00; i_00 = i_00 + 1) {
    set(this,i_00,init);
  }
  return;
}

Assistant:

compact_vector(uint64_t size, uint32_t width, uint64_t init) : compact_vector{size, width} {
        for (uint64_t i = 0; i < size; ++i) {
            set(i, init);
        }
    }